

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O2

uint64_t __thiscall
icu_63::number::impl::DecimalQuantity::getPositionFingerprint(DecimalQuantity *this)

{
  return (ulong)(uint)this->rOptPos << 0x30 ^ (ulong)(uint)this->rReqPos << 0x20 ^
         (long)(this->lReqPos << 0x10 ^ this->lOptPos);
}

Assistant:

uint64_t DecimalQuantity::getPositionFingerprint() const {
    uint64_t fingerprint = 0;
    fingerprint ^= lOptPos;
    fingerprint ^= (lReqPos << 16);
    fingerprint ^= (static_cast<uint64_t>(rReqPos) << 32);
    fingerprint ^= (static_cast<uint64_t>(rOptPos) << 48);
    return fingerprint;
}